

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall vera::Vbo::setDrawMode(Vbo *this,DrawMode _drawMode)

{
  DrawMode _drawMode_local;
  Vbo *this_local;
  
  if (_drawMode == POINTS) {
    this->m_drawMode = 0;
  }
  else if (_drawMode == LINE_STRIP) {
    this->m_drawMode = 3;
  }
  else if (_drawMode == LINE_LOOP) {
    this->m_drawMode = 2;
  }
  else if (_drawMode == LINES) {
    this->m_drawMode = 1;
  }
  else if (_drawMode == TRIANGLES) {
    this->m_drawMode = 4;
  }
  else if (_drawMode == TRIANGLE_STRIP) {
    this->m_drawMode = 5;
  }
  else if (_drawMode == TRIANGLE_FAN) {
    this->m_drawMode = 6;
  }
  return;
}

Assistant:

void Vbo::setDrawMode(DrawMode _drawMode) {
    if (_drawMode == POINTS)
        m_drawMode = GL_POINTS;
    else if (_drawMode == LINE_STRIP)
        m_drawMode = GL_LINE_STRIP;
    else if (_drawMode == LINE_LOOP)
        m_drawMode = GL_LINE_LOOP;
    else if (_drawMode == LINES)
        m_drawMode = GL_LINES;
    else if (_drawMode == TRIANGLES)
        m_drawMode = GL_TRIANGLES;
    else if (_drawMode == TRIANGLE_STRIP)
        m_drawMode = GL_TRIANGLE_STRIP;
    else if (_drawMode == TRIANGLE_FAN)
        m_drawMode = GL_TRIANGLE_FAN;
    // else if (_drawMode == QUADS)
    //     m_drawMode = GL_QUADS;
}